

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O1

int gdImageBrightness(gdImagePtr src,int brightness)

{
  uint uVar1;
  int color;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  int g;
  int x;
  uint uVar5;
  int r;
  uint uVar6;
  int b;
  
  iVar3 = 0;
  if ((0xfffffe00 < brightness - 0x100U && src != (gdImagePtr)0x0) && (iVar3 = 1, brightness != 0))
  {
    if (src->trueColor == 0) {
      pcVar2 = gdImageGetPixel;
    }
    else {
      pcVar2 = gdImageGetTrueColorPixel;
    }
    if (0 < src->sy) {
      iVar3 = 0;
      do {
        if (0 < src->sx) {
          x = 0;
          do {
            uVar1 = (*pcVar2)(src,x,iVar3);
            if (src->trueColor == 0) {
              uVar5 = src->red[(int)uVar1];
              uVar4 = src->green[(int)uVar1];
              uVar6 = src->blue[(int)uVar1];
              uVar1 = src->alpha[(int)uVar1];
            }
            else {
              uVar5 = uVar1 >> 0x10 & 0xff;
              uVar4 = uVar1 >> 8 & 0xff;
              uVar6 = uVar1 & 0xff;
              uVar1 = uVar1 >> 0x18 & 0x7f;
            }
            r = uVar5 + brightness;
            if (r < 1) {
              r = 0;
            }
            if (0xfe < r) {
              r = 0xff;
            }
            g = uVar4 + brightness;
            if (g < 1) {
              g = 0;
            }
            if (0xfe < g) {
              g = 0xff;
            }
            b = uVar6 + brightness;
            if (b < 1) {
              b = 0;
            }
            if (0xfe < b) {
              b = 0xff;
            }
            color = gdImageColorAllocateAlpha(src,r,g,b,uVar1);
            if (color == -1) {
              color = gdImageColorClosestAlpha(src,r,g,b,uVar1);
            }
            gdImageSetPixel(src,x,iVar3,color);
            x = x + 1;
          } while (x < src->sx);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < src->sy);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

BGD_DECLARE(int) gdImageBrightness(gdImagePtr src, int brightness)
{
	int x, y;
	int r,g,b,a;
	int new_pxl, pxl;
	FuncPtr f;

	if (src==NULL || (brightness < -255 || brightness > 255)) {
		return 0;
	}

	if (brightness==0) {
		return 1;
	}

	f = GET_PIXEL_FUNCTION(src);

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f (src, x, y);

			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			r = r + brightness;
			g = g + brightness;
			b = b + brightness;

			r = (r > 255)? 255 : ((r < 0)? 0:r);
			g = (g > 255)? 255 : ((g < 0)? 0:g);
			b = (b > 255)? 255 : ((b < 0)? 0:b);

			new_pxl = gdImageColorAllocateAlpha(src, (int)r, (int)g, (int)b, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)r, (int)g, (int)b, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}